

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
          (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
           *this,GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *os)

{
  Ch c;
  bool bVar1;
  char *pcVar2;
  Ch *pCVar3;
  long *plVar4;
  bool bVar5;
  GenericStringStream<rapidjson::UTF8<char>_> source;
  PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
  target;
  bool local_49;
  GenericStringStream<rapidjson::UTF8<char>_> local_48;
  PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
  local_38;
  
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x42e,
                  "bool rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Stringify(OutputStream &) const [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator, uriFragment = true, OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>]"
                 );
  }
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&os->stack_,1);
  *pcVar2 = '#';
  local_49 = *(long *)(this + 0x20) == 0;
  if (!local_49) {
    plVar4 = *(long **)(this + 0x18);
    do {
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&os->stack_,1);
      *pcVar2 = '/';
      bVar5 = (int)plVar4[1] != 0;
      if (bVar5) {
        pCVar3 = (Ch *)0x0;
        do {
          c = pCVar3[*plVar4];
          if (c == '/') {
            pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&os->stack_,1);
            *pcVar2 = '~';
            pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&os->stack_,1);
            *pcVar2 = '1';
LAB_001436d0:
            bVar1 = true;
          }
          else {
            if (c == '~') {
              pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&os->stack_,1);
              *pcVar2 = '~';
              pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&os->stack_,1);
              *pcVar2 = '0';
              goto LAB_001436d0;
            }
            bVar1 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                    ::NeedPercentEncode((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                                         *)this,c);
            if (!bVar1) {
              pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&os->stack_,1);
              *pcVar2 = c;
              goto LAB_001436d0;
            }
            local_48.src_ = pCVar3 + *plVar4;
            local_48.head_ = local_48.src_;
            local_38.os_ = os;
            bVar1 = UTF8<char>::
                    Validate<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>>
                              (&local_48,&local_38);
            if (bVar1) {
              pCVar3 = local_48.src_ + (long)(pCVar3 + ~(ulong)local_48.head_);
            }
          }
          if (bVar1 == false) {
            if (bVar5) {
              return local_49;
            }
            break;
          }
          pCVar3 = pCVar3 + 1;
          bVar5 = pCVar3 < (Ch *)(ulong)*(uint *)(plVar4 + 1);
        } while (bVar5);
      }
      plVar4 = plVar4 + 2;
      local_49 = plVar4 == (long *)(*(long *)(this + 0x20) * 0x10 + *(long *)(this + 0x18));
    } while (!local_49);
  }
  return local_49;
}

Assistant:

bool IsValid() const { return parseErrorCode_ == kPointerParseErrorNone; }